

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O1

void sym_set_global(int pass,char *id)

{
  int iVar1;
  sym_s *psVar2;
  
  psVar2 = root;
  if (pass == 1) {
    return;
  }
  do {
    if (psVar2 == (sym_t *)0x0) {
LAB_00108446:
      err(E,"symbol \'%s\' declared global but not defined",id);
      return;
    }
    iVar1 = strcmp(psVar2->id,id);
    if (iVar1 == 0) {
      if (psVar2->type == _global) {
        err(W,"symbol \'%s\' declared global more than once",id);
      }
      else if (psVar2->type == _extern) goto LAB_00108446;
      psVar2->type = _global;
      return;
    }
    psVar2 = psVar2->next;
  } while( true );
}

Assistant:

void sym_set_global(int pass, char* id)
{
    sym_t* psym;
    if (pass == READ_PASS)
        return;

    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
            break;
        psym = psym->next;
    }
    
    if (psym == NULL)
    {
        err(E, "symbol '%s' declared global but not defined", id);
        return;
    }
    
    if (psym->type == _extern)
    {
        err(E, "symbol '%s' declared global but not defined", id);
        return;
    }
    
    if (psym->type == _global)
        err(W, "symbol '%s' declared global more than once", id);
    
    psym->type = _global;
}